

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O2

bool __thiscall CNetAddr::SetSpecial(CNetAddr *this,string *addr)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  char *in_RDX;
  long in_FS_OFFSET;
  string_view str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = in_RDX;
  str._M_len = (size_t)(addr->_M_dataplus)._M_p;
  bVar2 = util::ContainsNoNUL((util *)addr->_M_string_length,str);
  if (bVar2) {
    bVar3 = SetTor(this,addr);
    bVar2 = true;
    if (!bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        bVar2 = SetI2P(this,addr);
        return bVar2;
      }
      goto LAB_00a9600c;
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
LAB_00a9600c:
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::SetSpecial(const std::string& addr)
{
    if (!ContainsNoNUL(addr)) {
        return false;
    }

    if (SetTor(addr)) {
        return true;
    }

    if (SetI2P(addr)) {
        return true;
    }

    return false;
}